

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<signed_char,(unsigned_char)16>>(Thread *this)

{
  u8 i;
  long lVar1;
  uint uVar2;
  uint uVar3;
  Simd<signed_char,_(unsigned_char)__x10_> val;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  lVar1 = 0;
  uVar2 = 0;
  do {
    uVar3 = 1 << ((byte)lVar1 & 0x1f);
    if (-1 < *(char *)((long)&local_18 + lVar1)) {
      uVar3 = 0;
    }
    uVar2 = uVar2 | uVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  Push(this,(Value)ZEXT416(uVar2));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}